

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_writeGPIODir(SoapySDRDevice *device,char *bank,uint dir)

{
  undefined1 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_38,bank,&local_39);
  (**(code **)(*(long *)device + 0x380))(device,local_38,dir);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int SoapySDRDevice_writeGPIODir(SoapySDRDevice *device, const char *bank, const unsigned dir)
{
    __SOAPY_SDR_C_TRY
    device->writeGPIODir(bank, dir);
    __SOAPY_SDR_C_CATCH
}